

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O0

void __thiscall
RecoveryTest_RaiseExceptionTest_Test::~RecoveryTest_RaiseExceptionTest_Test
          (RecoveryTest_RaiseExceptionTest_Test *this)

{
  RecoveryTest_RaiseExceptionTest_Test *this_local;
  
  ~RecoveryTest_RaiseExceptionTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (RecoveryTest, RaiseExceptionTest) {
#ifdef _WIN32
    const char regex[] = "Chillout SehHandler";
#else
    const char regex[] = "posixSignalHandler";
#endif
    ASSERT_EXIT(RaiseSehException(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGTERM), regex);
}